

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O3

shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_> __thiscall
cs_impl::
cni_helper<std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_(*)(std::shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_&),_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_(*)(std::shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
::_call<0>(cni_helper<std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_(*)(std::shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_&),_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_(*)(std::shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
           *this,vector *args,sequence<0> *param_2)

{
  shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *psVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_> sVar2;
  undefined8 local_28;
  undefined8 uStack_20;
  
  psVar1 = try_convert_and_check<std::shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0UL>
           ::convert(*(var **)param_2);
  if ((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)args[1].super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
              super__Vector_impl_data._M_start)(&local_28,args,psVar1);
    *(undefined8 *)&(this->mFunc).super__Function_base._M_functor = local_28;
    *(undefined8 *)((long)&(this->mFunc).super__Function_base._M_functor + 8) = uStack_20;
    sVar2.
    super___shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = extraout_RDX._M_pi;
    sVar2.
    super___shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)this;
    return (shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>)
           sVar2.
           super___shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  std::__throw_bad_function_call();
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}